

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

int ImStb::stb_textedit_paste
              (ImGuiInputTextState *str,STB_TexteditState *state,ImWchar *ctext,int len)

{
  int iVar1;
  undefined4 in_ECX;
  ImGuiInputTextState *in_RDX;
  ImWchar *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = stb_textedit_paste_internal
                    (in_RDX,(STB_TexteditState *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,0);
  return iVar1;
}

Assistant:

static int stb_textedit_paste(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_CHARTYPE const *ctext, int len)
{
   return stb_textedit_paste_internal(str, state, (STB_TEXTEDIT_CHARTYPE *) ctext, len);
}